

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O1

void __thiscall
iu_MatcherFailure_x_iutest_x_Equals_Test::Body(iu_MatcherFailure_x_iutest_x_Equals_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestFlag TVar2;
  undefined8 uVar3;
  TestFlag *pTVar4;
  Variable *pVVar5;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard_1;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_spi_ar_1;
  AssertionResult iutest_ar;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker_1;
  SPIFailureChecker iutest_failure_checker;
  TestFlag local_43c;
  string local_438;
  AssertionResult local_418;
  AssertionResult local_3f0;
  undefined1 local_3c8 [32];
  char *local_3a8;
  undefined8 local_3a0;
  TestFlag local_398;
  undefined4 uStack_394;
  long local_388 [2];
  SPIFailureChecker local_378;
  undefined1 local_340 [8];
  char (*local_338) [5];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  char *local_198;
  pointer local_190;
  Type local_188;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1b8);
  local_1b8._0_8_ = &PTR__Collector_0023f038;
  local_188 = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_398);
  local_340 = (undefined1  [8])&PTR__IMatcher_00240ce0;
  local_338 = (char (*) [5])0x208426;
  iutest::detail::EqMatcher<char[5]>::operator()
            ((AssertionResult *)local_3c8,(EqMatcher<char[5]> *)local_340,(char (*) [5])0x208472);
  if (local_3a8._0_1_ == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    iutest::PrintToString<char[5]>(&local_438,(char (*) [5])0x208472);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3f0.m_message,(detail *)local_438._M_dataplus._M_p,"Equals(\"Hoge\")",
               local_3c8,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,local_3f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_43c);
    local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2071b4;
    local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x200000266;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_378,(Fixed *)local_340,false);
    if (local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_378.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.m_message._M_dataplus._M_p != &local_3f0.m_message.field_2) {
      operator_delete(local_3f0.m_message._M_dataplus._M_p,
                      local_3f0.m_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((undefined1 *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_) != local_3c8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_),local_3c8._16_8_ + 1);
  }
  TVar2.m_test_flags = local_398.m_test_flags;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = TVar2.m_test_flags;
  local_330[0]._M_allocated_capacity = 0x65676f48203a7145;
  local_338 = (char (*) [5])0x8;
  local_330[0]._M_local_buf[8] = (__stringbuf_type)0x0;
  local_340 = (undefined1  [8])local_330;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_418,(SPIFailureChecker *)local_1b8,(string *)local_340);
  if (local_340 != (undefined1  [8])local_330) {
    operator_delete((void *)local_340,local_330[0]._M_allocated_capacity + 1);
  }
  local_1b8._0_8_ = &PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            ((vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> *)
             (local_1a8 + 8));
  uVar3 = local_1a8._0_8_;
  local_1b8._8_8_ = &PTR__ReporterHolder_0023f0e0;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter = (TestPartResultReporterInterface *)uVar3;
  if (local_418.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_418.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = (pointer)0x100000266;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  paVar1 = &local_418.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_418.m_message._M_dataplus._M_p,
                    local_418.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_1b8._0_4_ = 1;
  local_340 = (undefined1  [8])&PTR__IMatcher_0023f1d0;
  local_3c8._0_4_ = 0;
  local_338 = (char (*) [5])local_1b8;
  iutest::detail::EqMatcher<int>::operator()
            (&local_418,(EqMatcher<int> *)local_340,(int *)local_3c8);
  if (local_418.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::ostream::operator<<(local_330,0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_438,(detail *)CONCAT44(uStack_394,local_398.m_test_flags),"Equals(1)",
               (char *)&local_418,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,local_438._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_3a0._0_4_ = 0x267;
    local_3a0._4_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_3c8,(Fixed *)local_1b8,false);
    if ((undefined1 *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_) != local_3c8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_),local_3c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(uStack_394,local_398.m_test_flags) != local_388) {
      operator_delete((long *)CONCAT44(uStack_394,local_398.m_test_flags),local_388[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_418.m_message._M_dataplus._M_p,
                    local_418.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = local_43c.m_test_flags;
  local_330[0]._0_6_ = 0x31203a7145;
  local_338 = (char (*) [5])0x5;
  local_340 = (undefined1  [8])local_330;
  iutest::detail::SPIFailureChecker::GetResult(&local_3f0,&local_378,(string *)local_340);
  if (local_340 != (undefined1  [8])local_330) {
    operator_delete((void *)local_340,local_330[0]._M_allocated_capacity + 1);
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter =
       local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  if (local_3f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3f0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = (pointer)0x100000267;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_message._M_dataplus._M_p != &local_3f0.m_message.field_2) {
    operator_delete(local_3f0.m_message._M_dataplus._M_p,
                    local_3f0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, Equals)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", Equals("Hoge")) , "Eq: Hoge" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0, Equals(1)), "Eq: 1" );
}